

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O0

void __thiscall wasm::Vacuum::visitBlock(Vacuum *this,Block *curr)

{
  Expression *pEVar1;
  bool bVar2;
  ExpressionList *this_00;
  Expression *pEVar3;
  Expression **ppEVar4;
  Function *func;
  Module *wasm;
  Type TVar5;
  size_t sVar6;
  bool local_a9;
  bool local_89;
  Expression *remove;
  BasicType local_70;
  Index i;
  Type local_68;
  uintptr_t local_60;
  Type local_58;
  Type childType;
  Expression *optimized;
  bool used;
  Expression *child;
  size_t z;
  size_t size;
  ExpressionList *list;
  int skip;
  Block *curr_local;
  Vacuum *this_local;
  
  list._4_4_ = 0;
  this_00 = &curr->list;
  pEVar3 = (Expression *)
           ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                     (&this_00->
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  child = (Expression *)0x0;
  do {
    if (pEVar3 <= child) goto LAB_01b8759b;
    ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&this_00->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(size_t)child);
    pEVar1 = *ppEVar4;
    local_89 = false;
    if (child == (Expression *)((long)&pEVar3[-1].type.id + 7)) {
      bVar2 = wasm::Type::isConcrete
                        (&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression
                          .type);
      local_89 = false;
      if (bVar2) {
        func = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getFunction
                         ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                          &(this->
                           super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                           ).
                           super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                         );
        local_89 = ExpressionAnalyzer::isResultUsed
                             (&(this->
                               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                               ).
                               super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                               .expressionStack,func);
      }
    }
    childType.id = (uintptr_t)optimize(this,pEVar1,local_89,true);
    TVar5.id = childType.id;
    if ((Expression *)childType.id == (Expression *)0x0) {
      local_58.id = (pEVar1->type).id;
      bVar2 = wasm::Type::isConcrete(&local_58);
      TVar5.id = (uintptr_t)pEVar1;
      if (bVar2) {
        local_60 = local_58.id;
        bVar2 = LiteralUtils::canMakeZero(local_58);
        if (bVar2) {
          local_68.id = local_58.id;
          wasm = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getModule
                           ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                            &(this->
                             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                             ).
                             super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                           );
          TVar5.id = (uintptr_t)LiteralUtils::makeZero(local_68,wasm);
        }
      }
      else {
        i = 1;
        bVar2 = wasm::Type::operator==(&local_58,&i);
        if (!bVar2) {
          TVar5 = childType;
        }
      }
    }
    childType.id = TVar5.id;
    if (childType.id == 0) {
      TypeUpdater::noteRecursiveRemoval(&this->typeUpdater,pEVar1);
      list._4_4_ = list._4_4_ + 1;
    }
    else {
      if ((Expression *)childType.id != pEVar1) {
        TypeUpdater::noteReplacement(&this->typeUpdater,pEVar1,(Expression *)childType.id,false);
        TVar5 = childType;
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this_00->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(size_t)child);
        *ppEVar4 = (Expression *)TVar5.id;
      }
      if (0 < list._4_4_) {
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this_00->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(size_t)child);
        pEVar1 = *ppEVar4;
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this_00->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(long)child - (long)list._4_4_);
        *ppEVar4 = pEVar1;
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this_00->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(size_t)child);
        *ppEVar4 = (Expression *)0x0;
      }
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this_00->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(long)child - (long)list._4_4_);
      local_70 = unreachable;
      local_a9 = wasm::Type::operator==(&(*ppEVar4)->type,&local_70);
      local_a9 = local_a9 && child < (Expression *)((long)&pEVar3[-1].type.id + 7U);
      if (local_a9) {
        remove._4_4_ = (int)child - list._4_4_;
        while( true ) {
          remove._4_4_ = remove._4_4_ + 1;
          sVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                            (&this_00->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            );
          if (sVar6 <= remove._4_4_) break;
          ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&this_00->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,(ulong)remove._4_4_);
          if (*ppEVar4 != (Expression *)0x0) {
            TypeUpdater::noteRecursiveRemoval(&this->typeUpdater,*ppEVar4);
          }
        }
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                  (&this_00->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (long)child + (1 - (long)list._4_4_));
        TypeUpdater::maybeUpdateTypeToUnreachable(&this->typeUpdater,curr);
        list._4_4_ = 0;
LAB_01b8759b:
        if (0 < list._4_4_) {
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                    (&this_00->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     (long)pEVar3 - (long)list._4_4_);
          TypeUpdater::maybeUpdateTypeToUnreachable(&this->typeUpdater,curr);
        }
        pEVar3 = BlockUtils::simplifyToContents<wasm::Vacuum>(curr,this,false);
        replaceCurrent(this,pEVar3);
        return;
      }
    }
    child = (Expression *)((long)&child->_id + 1);
  } while( true );
}

Assistant:

void visitBlock(Block* curr) {
    // compress out nops and other dead code
    int skip = 0;
    auto& list = curr->list;
    size_t size = list.size();
    for (size_t z = 0; z < size; z++) {
      auto* child = list[z];
      // The last element may be used.
      bool used =
        z == size - 1 && curr->type.isConcrete() &&
        ExpressionAnalyzer::isResultUsed(expressionStack, getFunction());
      auto* optimized = optimize(child, used, true);
      if (!optimized) {
        auto childType = child->type;
        if (childType.isConcrete()) {
          if (LiteralUtils::canMakeZero(childType)) {
            // We can't just skip a final concrete element, even if it isn't
            // used. Instead, replace it with something that's easy to optimize
            // out (for example, code-folding can merge out identical zeros at
            // the end of if arms).
            optimized = LiteralUtils::makeZero(childType, *getModule());
          } else {
            // Don't optimize it out.
            optimized = child;
          }
        } else if (childType == Type::unreachable) {
          // Don't try to optimize out an unreachable child (dce can do that
          // properly).
          optimized = child;
        }
      }
      if (!optimized) {
        typeUpdater.noteRecursiveRemoval(child);
        skip++;
      } else {
        if (optimized != child) {
          typeUpdater.noteReplacement(child, optimized);
          list[z] = optimized;
        }
        if (skip > 0) {
          list[z - skip] = list[z];
          list[z] = nullptr;
        }
        // if this is unreachable, the rest is dead code
        if (list[z - skip]->type == Type::unreachable && z < size - 1) {
          for (Index i = z - skip + 1; i < list.size(); i++) {
            auto* remove = list[i];
            if (remove) {
              typeUpdater.noteRecursiveRemoval(remove);
            }
          }
          list.resize(z - skip + 1);
          typeUpdater.maybeUpdateTypeToUnreachable(curr);
          skip = 0; // nothing more to do on the list
          break;
        }
      }
    }
    if (skip > 0) {
      list.resize(size - skip);
      typeUpdater.maybeUpdateTypeToUnreachable(curr);
    }
    // the block may now be a trivial one that we can get rid of and just leave
    // its contents
    replaceCurrent(BlockUtils::simplifyToContents(curr, this));
  }